

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

void run_negation_range_test8(void)

{
  _Bool unaff_retaddr;
  
  run_negation_range_tests(1000,2,0,0,3,0,false,unaff_retaddr);
  return;
}

Assistant:

DEFINE_TEST(run_negation_range_test8) {
    // runs of length 2..67 begin every 10000
    // starting at 0.
    // last run starts at 65000 hence we end outside
    // a run
    // negation over whole range.  Result should be
    // run and will fit.

    run_negation_range_tests(1000, 2, 0, 0x0000, 0x10000, RUN_CONTAINER_TYPE,
                             false, false);
}